

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void drawImage6(Array2D<GZ> *px,int w,int h)

{
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  double in_stack_00000078;
  double in_stack_00000080;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  Array2D<GZ> *in_stack_000000a0;
  int in_stack_000000b0;
  int in_stack_000000b8;
  int in_stack_000000c0;
  
  anon_unknown.dwarf_113f::mndl<GZ>
            (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094,
             in_stack_00000090,in_stack_0000008c,in_stack_000000b0,in_stack_000000b8,
             in_stack_000000c0,in_stack_00000080,in_stack_00000078,in_stack_00000070,
             in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void
drawImage6 (Array2D<GZ>& px, int w, int h)
{
    mndl (px, w, h, 0, w, 0, h, 3, 3, -2.5, 1.0, -1.3333, 1, 0, 0);
}